

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int bio_fwrite_3d(void ***arr,size_t e_sz,uint32 d1,uint32 d2,uint32 d3,FILE *fp,uint32 *chksum)

{
  int32 iVar1;
  size_t ret;
  FILE *fp_local;
  uint32 local_28;
  uint32 d3_local;
  uint32 d2_local;
  uint32 d1_local;
  size_t e_sz_local;
  void ***arr_local;
  
  fp_local._4_4_ = d3;
  local_28 = d2;
  d3_local = d1;
  _d2_local = e_sz;
  e_sz_local = (size_t)arr;
  iVar1 = bio_fwrite(&d3_local,4,1,fp,0,chksum);
  if (iVar1 == 1) {
    iVar1 = bio_fwrite(&local_28,4,1,fp,0,chksum);
    if (iVar1 == 1) {
      iVar1 = bio_fwrite((void *)((long)&fp_local + 4),4,1,fp,0,chksum);
      if (iVar1 == 1) {
        arr_local._4_4_ =
             bio_fwrite_1d((void *)**(undefined8 **)e_sz_local,_d2_local,
                           d3_local * local_28 * fp_local._4_4_,fp,chksum);
      }
      else {
        if (iVar1 == 0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                         ,0x221,"Unable to write complete data");
        }
        else {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                         ,0x224,"OS error in bio_fwrite_3d");
        }
        arr_local._4_4_ = -1;
      }
    }
    else {
      if (iVar1 == 0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                       ,0x215,"Unable to write complete data");
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                       ,0x218,"OS error in bio_fwrite_3d");
      }
      arr_local._4_4_ = -1;
    }
  }
  else {
    if (iVar1 == 0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                     ,0x209,"Unable to write complete data");
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                     ,0x20c,"OS error in bio_fwrite_3d");
    }
    arr_local._4_4_ = -1;
  }
  return arr_local._4_4_;
}

Assistant:

int
bio_fwrite_3d(void ***arr,
	   size_t e_sz,
	   uint32 d1,
	   uint32 d2,
	   uint32 d3,
	   FILE *fp,
	   uint32 *chksum)
{
    size_t ret;

    /* write out first dimension 1 */
    ret = bio_fwrite(&d1, sizeof(uint32), 1, fp, 0, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_3d");
	}
	return -1;
    }

    /* write out first dimension 2 */
    ret = bio_fwrite(&d2, sizeof(uint32), 1, fp, 0, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_3d");
	}
	return -1;
    }

    /* write out first dimension 3 */
    ret = bio_fwrite(&d3, sizeof(uint32), 1, fp, 0, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_3d");
	}
	return -1;
    }

    /* write out the data in the array as one big block */
    return bio_fwrite_1d(arr[0][0], e_sz, d1 * d2 * d3, fp, chksum);
}